

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O1

void __thiscall
icu_63::numparse::impl::AffixPatternMatcher::~AffixPatternMatcher(AffixPatternMatcher *this)

{
  (this->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
  super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__AffixPatternMatcher_003d9d90;
  MaybeStackArray<char16_t,_4>::~MaybeStackArray(&(this->fPattern).fBuffer);
  (this->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
  super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__ArraySeriesMatcher_003daee0;
  MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
            (&(this->super_ArraySeriesMatcher).fMatchers);
  operator_delete(this);
  return;
}

Assistant:

class U_I18N_API AffixPatternMatcher : public ArraySeriesMatcher {
  public:
    AffixPatternMatcher() = default;  // WARNING: Leaves the object in an unusable state

    static AffixPatternMatcher fromAffixPattern(const UnicodeString& affixPattern,
                                                AffixTokenMatcherWarehouse& warehouse,
                                                parse_flags_t parseFlags, bool* success,
                                                UErrorCode& status);

    UnicodeString getPattern() const;

    bool operator==(const AffixPatternMatcher& other) const;

  private:
    CompactUnicodeString<4> fPattern;

    AffixPatternMatcher(MatcherArray& matchers, int32_t matchersLen, const UnicodeString& pattern);

    friend class AffixPatternMatcherBuilder;
}